

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_OneString_Test::~TApp_OneString_Test(TApp_OneString_Test *this)

{
  TApp_OneString_Test *this_local;
  
  ~TApp_OneString_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, OneString) {
    std::string str;
    app.add_option("-s,--string", str);
    args = {"--string", "mystring"};
    run();
    EXPECT_EQ((size_t)1, app.count("-s"));
    EXPECT_EQ((size_t)1, app.count("--string"));
    EXPECT_EQ(str, "mystring");
}